

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CConnman::SocketHandlerConnected
          (CConnman *this,vector<CNode_*,_std::allocator<CNode_*>_> *nodes,
          EventsPerSock *events_per_sock)

{
  string *__return_storage_ptr__;
  CNode *node;
  element_type *peVar1;
  long *plVar2;
  code *pcVar3;
  undefined8 uVar4;
  LogFlags LVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 *puVar8;
  bool bVar9;
  uint uVar10;
  const_iterator cVar11;
  int *piVar12;
  byte bVar13;
  pointer ppCVar14;
  undefined1 *puVar16;
  int iVar17;
  byte bVar18;
  byte bVar19;
  long in_FS_OFFSET;
  Span<const_unsigned_char> msg_bytes;
  string_view source_file;
  string_view source_file_00;
  pair<unsigned_long,_bool> pVar20;
  string_view logging_function;
  string_view logging_function_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock69;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock67;
  long lVar15;
  
  puVar8 = &stack0xffffffffffffffd0;
  do {
    puVar16 = puVar8;
    *(undefined8 *)(puVar16 + -0x1000) = 0;
    puVar8 = puVar16 + -0x1000;
  } while ((bool *)(puVar16 + -0x1000) != &criticalblock67.super_unique_lock._M_owns);
  *(EventsPerSock **)(puVar16 + -0x1058) = events_per_sock;
  *(undefined8 *)(puVar16 + 0xeff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ppCVar14 = (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  *(pointer *)(puVar16 + -0x1048) =
       (nodes->super__Vector_base<CNode_*,_std::allocator<CNode_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  *(CConnman **)(puVar16 + -0x1068) = this;
  *(CThreadInterrupt **)(puVar16 + -0x1050) = &this->interruptNet;
  while (ppCVar14 != *(pointer *)(puVar16 + -0x1048)) {
    node = *ppCVar14;
    *(undefined8 *)(puVar16 + -0x1070) = 0x712797;
    bVar9 = CThreadInterrupt::operator_cast_to_bool(*(CThreadInterrupt **)(puVar16 + -0x1050));
    if (bVar9) break;
    *(pointer *)(puVar16 + -0x1060) = ppCVar14;
    bVar13 = 0;
    *(undefined8 *)(puVar16 + -0x1070) = 0x7127d1;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)(puVar16 + -0x1008),&node->m_sock_mutex,
               "pnode->m_sock_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
               0x816,false);
    peVar1 = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(Mutex **)(puVar16 + -0x1038) = &node->m_sock_mutex;
    *(shared_ptr<Sock> **)(puVar16 + -0x1040) = &node->m_sock;
    if (peVar1 == (element_type *)0x0) {
      bVar18 = 0;
      bVar19 = 0;
      *(undefined8 *)(puVar16 + -0x1070) = 3;
      iVar17 = (int)*(undefined8 *)(puVar16 + -0x1070);
    }
    else {
      *(undefined8 *)(puVar16 + -0x1070) = 0x7127f0;
      std::__shared_ptr<Sock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Sock,void>
                ((__shared_ptr<Sock_const,(__gnu_cxx::_Lock_policy)2> *)(puVar16 + -0x1028),
                 &(node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>);
      *(undefined8 *)(puVar16 + -0x1070) = 0x7127fd;
      cVar11 = std::
               _Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(*(_Hashtable<std::shared_ptr<const_Sock>,_std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>,_std::__detail::_Select1st,_Sock::EqualSharedPtrSock,_Sock::HashSharedPtrSock,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        **)(puVar16 + -0x1058),(key_type *)(puVar16 + -0x1028));
      *(undefined8 *)(puVar16 + -0x1070) = 0x71280a;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar16 + -0x1020));
      iVar17 = 0;
      if (cVar11.
          super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
          ._M_cur == (__node_type *)0x0) {
        bVar13 = 0;
        bVar18 = 0;
        bVar19 = 0;
      }
      else {
        bVar19 = *(byte *)((long)cVar11.
                                 super__Node_iterator_base<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_true>
                                 ._M_cur + 0x19);
        bVar18 = (bVar19 & 2) >> 1;
        bVar13 = (bVar19 & 4) >> 2;
      }
    }
    *(undefined8 *)(puVar16 + -0x1070) = 0x712847;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(puVar16 + -0x1008));
    if (peVar1 == (element_type *)0x0) {
LAB_00712983:
      lVar15 = *(long *)(puVar16 + -0x1060);
      if ((iVar17 != 3) && (iVar17 != 0)) break;
    }
    else {
      if (bVar18 != 0) {
        *(undefined8 *)(puVar16 + -0x1070) = 0x712880;
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::mutex>_> *)(puVar16 + -0x1008),&node->cs_vSend,
                   "pnode->cs_vSend",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                   ,0x824,false);
        *(undefined8 *)(puVar16 + -0x1070) = 0x71288c;
        pVar20 = SocketSendData(*(CConnman **)(puVar16 + -0x1068),node);
        *(undefined8 *)(puVar16 + -0x1070) = 0x71289a;
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(puVar16 + -0x1008));
        if (pVar20.first != 0) {
          *(undefined8 *)(puVar16 + -0x1070) = 0x7128ab;
          RecordBytesSent(*(CConnman **)(puVar16 + -0x1068),pVar20.first);
          if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            bVar19 = 0;
          }
        }
      }
      __return_storage_ptr__ = (string *)(puVar16 + -0x1028);
      if ((bVar19 & 1) != 0 || bVar13 != 0) {
        uVar10 = 0;
        *(undefined8 *)(puVar16 + -0x1070) = 0x7128f5;
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::mutex>_> *)__return_storage_ptr__,
                   *(AnnotatedMixin<std::mutex> **)(puVar16 + -0x1038),"pnode->m_sock_mutex",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                   ,0x839,false);
        plVar2 = (long *)**(long **)(puVar16 + -0x1040);
        *(undefined8 *)(puVar16 + -0x1070) = 3;
        iVar17 = (int)*(undefined8 *)(puVar16 + -0x1070);
        if (plVar2 != (long *)0x0) {
          lVar15 = *plVar2;
          *(undefined8 *)(puVar16 + -0x1070) = 0x40;
          uVar4 = *(undefined8 *)(puVar16 + -0x1070);
          pcVar3 = *(code **)(lVar15 + 0x20);
          *(undefined8 *)(puVar16 + -0x1070) = 0x71291b;
          uVar10 = (*pcVar3)(plVar2,puVar16 + -0x1008,0x10000,uVar4);
          iVar17 = 0;
        }
        *(undefined8 *)(puVar16 + -0x1070) = 0x712928;
        std::unique_lock<std::mutex>::~unique_lock
                  ((unique_lock<std::mutex> *)__return_storage_ptr__);
        if (plVar2 == (long *)0x0) goto LAB_00712983;
        if ((int)uVar10 < 1) {
          if (uVar10 == 0) {
            if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
              *(undefined8 *)(puVar16 + -0x1070) = 1;
              LVar5 = *(LogFlags *)(puVar16 + -0x1070);
              *(undefined8 *)(puVar16 + -0x1070) = 1;
              uVar4 = *(undefined8 *)(puVar16 + -0x1070);
              *(undefined8 *)(puVar16 + -0x1070) = 0x712a5d;
              bVar9 = ::LogAcceptCategory(LVar5,(Level)uVar4);
              if (bVar9) {
                *(NodeId *)(puVar16 + -0x1028) = node->id;
                *(undefined8 *)(puVar16 + -0x1078) = 0x16;
                sVar6 = *(size_t *)(puVar16 + -0x1078);
                *(undefined8 *)(puVar16 + -0x1078) = 0x50;
                sVar7 = *(size_t *)(puVar16 + -0x1078);
                *(undefined8 *)(puVar16 + -0x1078) = 1;
                LVar5 = *(LogFlags *)(puVar16 + -0x1078);
                *(string **)(puVar16 + -0x1078) = __return_storage_ptr__;
                *(char **)(puVar16 + -0x1080) = "socket closed for peer=%d\n";
                *(undefined8 *)(puVar16 + -0x1088) = 1;
                *(undefined8 *)(puVar16 + -0x1090) = 0x712aa0;
                source_file_00._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file_00._M_len = sVar7;
                logging_function_00._M_str = "SocketHandlerConnected";
                logging_function_00._M_len = sVar6;
                LogPrintf_<long>(logging_function_00,source_file_00,0x84f,LVar5,
                                 *(Level *)(puVar16 + -0x1088),*(char **)(puVar16 + -0x1080),
                                 *(long **)(puVar16 + -0x1078));
              }
            }
          }
          else {
            *(undefined8 *)(puVar16 + -0x1070) = 0x7129ae;
            piVar12 = __errno_location();
            iVar17 = *piVar12;
            if ((((iVar17 == 4) || (iVar17 == 0xb)) || (iVar17 == 0x5a)) || (iVar17 == 0x73))
            goto LAB_00712aac;
            if (((node->fDisconnect)._M_base._M_i & 1U) == 0) {
              *(undefined8 *)(puVar16 + -0x1070) = 1;
              LVar5 = *(LogFlags *)(puVar16 + -0x1070);
              *(undefined8 *)(puVar16 + -0x1070) = 1;
              uVar4 = *(undefined8 *)(puVar16 + -0x1070);
              *(undefined8 *)(puVar16 + -0x1070) = 0x7129ea;
              bVar9 = ::LogAcceptCategory(LVar5,(Level)uVar4);
              if (bVar9) {
                *(NodeId *)(puVar16 + -0x1030) = node->id;
                *(undefined8 *)(puVar16 + -0x1070) = 0x712a04;
                NetworkErrorString_abi_cxx11_(__return_storage_ptr__,iVar17);
                *(undefined8 *)(puVar16 + -0x1070) = 0x16;
                sVar6 = *(size_t *)(puVar16 + -0x1070);
                *(undefined8 *)(puVar16 + -0x1070) = 0x50;
                sVar7 = *(size_t *)(puVar16 + -0x1070);
                *(undefined8 *)(puVar16 + -0x1070) = 1;
                LVar5 = *(LogFlags *)(puVar16 + -0x1070);
                *(string **)(puVar16 + -0x1070) = __return_storage_ptr__;
                *(undefined1 **)(puVar16 + -0x1078) = puVar16 + -0x1030;
                *(char **)(puVar16 + -0x1080) = "socket recv error for peer=%d: %s\n";
                *(undefined8 *)(puVar16 + -0x1088) = 1;
                *(undefined8 *)(puVar16 + -0x1090) = 0x712a39;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                ;
                source_file._M_len = sVar7;
                logging_function._M_str = "SocketHandlerConnected";
                logging_function._M_len = sVar6;
                LogPrintf_<long,std::__cxx11::string>
                          (logging_function,source_file,0x85a,LVar5,*(Level *)(puVar16 + -0x1088),
                           *(char **)(puVar16 + -0x1080),*(long **)(puVar16 + -0x1078),
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (puVar16 + -0x1070));
                *(undefined8 *)(puVar16 + -0x1070) = 0x712a45;
                std::__cxx11::string::~string((string *)__return_storage_ptr__);
              }
            }
          }
          *(undefined8 *)(puVar16 + -0x1070) = 0x712aac;
          CNode::CloseSocketDisconnect(node);
        }
        else {
          puVar16[-0x1028] = 0;
          *(undefined8 *)(puVar16 + -0x1070) = 0x71294d;
          msg_bytes.m_size._0_4_ = uVar10;
          msg_bytes.m_data = puVar16 + -0x1008;
          msg_bytes.m_size._4_4_ = 0;
          bVar9 = CNode::ReceiveMsgBytes(node,msg_bytes,(bool *)__return_storage_ptr__);
          if (!bVar9) {
            *(undefined8 *)(puVar16 + -0x1070) = 0x712959;
            CNode::CloseSocketDisconnect(node);
          }
          LOCK();
          *(long *)(*(long *)(puVar16 + -0x1068) + 0x28) =
               *(long *)(*(long *)(puVar16 + -0x1068) + 0x28) + (ulong)uVar10;
          UNLOCK();
          if (puVar16[-0x1028] == '\x01') {
            *(undefined8 *)(puVar16 + -0x1070) = 0x712975;
            CNode::MarkReceivedMsgsForProcessing(node);
            *(undefined8 *)(puVar16 + -0x1070) = 0x71297e;
            WakeMessageHandler(*(CConnman **)(puVar16 + -0x1068));
          }
        }
      }
LAB_00712aac:
      *(undefined8 *)(puVar16 + -0x1070) = 0x712ab8;
      bVar9 = InactivityCheck(*(CConnman **)(puVar16 + -0x1068),node);
      lVar15 = *(long *)(puVar16 + -0x1060);
      if (bVar9) {
        LOCK();
        (node->fDisconnect)._M_base._M_i = true;
        UNLOCK();
      }
    }
    ppCVar14 = (pointer)(lVar15 + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar16 + 0xeff8)) {
    *(undefined **)(puVar16 + -0x1070) = &UNK_00712b5d;
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::SocketHandlerConnected(const std::vector<CNode*>& nodes,
                                      const Sock::EventsPerSock& events_per_sock)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);

    for (CNode* pnode : nodes) {
        if (interruptNet)
            return;

        //
        // Receive
        //
        bool recvSet = false;
        bool sendSet = false;
        bool errorSet = false;
        {
            LOCK(pnode->m_sock_mutex);
            if (!pnode->m_sock) {
                continue;
            }
            const auto it = events_per_sock.find(pnode->m_sock);
            if (it != events_per_sock.end()) {
                recvSet = it->second.occurred & Sock::RECV;
                sendSet = it->second.occurred & Sock::SEND;
                errorSet = it->second.occurred & Sock::ERR;
            }
        }

        if (sendSet) {
            // Send data
            auto [bytes_sent, data_left] = WITH_LOCK(pnode->cs_vSend, return SocketSendData(*pnode));
            if (bytes_sent) {
                RecordBytesSent(bytes_sent);

                // If both receiving and (non-optimistic) sending were possible, we first attempt
                // sending. If that succeeds, but does not fully drain the send queue, do not
                // attempt to receive. This avoids needlessly queueing data if the remote peer
                // is slow at receiving data, by means of TCP flow control. We only do this when
                // sending actually succeeded to make sure progress is always made; otherwise a
                // deadlock would be possible when both sides have data to send, but neither is
                // receiving.
                if (data_left) recvSet = false;
            }
        }

        if (recvSet || errorSet)
        {
            // typical socket buffer is 8K-64K
            uint8_t pchBuf[0x10000];
            int nBytes = 0;
            {
                LOCK(pnode->m_sock_mutex);
                if (!pnode->m_sock) {
                    continue;
                }
                nBytes = pnode->m_sock->Recv(pchBuf, sizeof(pchBuf), MSG_DONTWAIT);
            }
            if (nBytes > 0)
            {
                bool notify = false;
                if (!pnode->ReceiveMsgBytes({pchBuf, (size_t)nBytes}, notify)) {
                    pnode->CloseSocketDisconnect();
                }
                RecordBytesRecv(nBytes);
                if (notify) {
                    pnode->MarkReceivedMsgsForProcessing();
                    WakeMessageHandler();
                }
            }
            else if (nBytes == 0)
            {
                // socket closed gracefully
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "socket closed for peer=%d\n", pnode->GetId());
                }
                pnode->CloseSocketDisconnect();
            }
            else if (nBytes < 0)
            {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS)
                {
                    if (!pnode->fDisconnect) {
                        LogDebug(BCLog::NET, "socket recv error for peer=%d: %s\n", pnode->GetId(), NetworkErrorString(nErr));
                    }
                    pnode->CloseSocketDisconnect();
                }
            }
        }

        if (InactivityCheck(*pnode)) pnode->fDisconnect = true;
    }
}